

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

void adjustContextSelectionsForCell
               (PaintContext *cell_context,QTextTableCell *cell,int r,int c,int *selectedTableCells)

{
  int iVar1;
  long i_00;
  qsizetype qVar2;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  long in_R8;
  int lastPosition;
  int firstPosition;
  int num_cols;
  int num_rows;
  int col_start;
  int row_start;
  int i;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  MoveMode m;
  int pos;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  while( true ) {
    i_00 = (long)iVar4;
    qVar2 = QList<QAbstractTextDocumentLayout::Selection>::size
                      ((QList<QAbstractTextDocumentLayout::Selection> *)(in_RDI + 0x38));
    if (qVar2 <= i_00) break;
    iVar3 = *(int *)(in_R8 + (long)(iVar4 << 2) * 4);
    pos = *(int *)(in_R8 + (long)(iVar4 * 4 + 1) * 4);
    m = *(MoveMode *)(in_R8 + (long)(iVar4 * 4 + 2) * 4);
    if (iVar3 != -1) {
      if ((((in_EDX < iVar3) || ((int)(iVar3 + m) <= in_EDX)) || (in_ECX < pos)) ||
         (pos + *(int *)(in_R8 + (long)(iVar4 * 4 + 3) * 4) <= in_ECX)) {
        QList<QAbstractTextDocumentLayout::Selection>::operator[]
                  ((QList<QAbstractTextDocumentLayout::Selection> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),i_00);
        QTextCursor::clearSelection
                  ((QTextCursor *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      }
      else {
        iVar1 = QTextTableCell::firstPosition
                          ((QTextTableCell *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        in_stack_ffffffffffffffc4 = QTextTableCell::lastPosition((QTextTableCell *)CONCAT44(pos,m));
        if (iVar1 == in_stack_ffffffffffffffc4) {
          in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1;
        }
        QList<QAbstractTextDocumentLayout::Selection>::operator[]
                  ((QList<QAbstractTextDocumentLayout::Selection> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),i_00);
        QTextCursor::setPosition((QTextCursor *)CONCAT44(iVar4,iVar3),pos,m);
        QList<QAbstractTextDocumentLayout::Selection>::operator[]
                  ((QList<QAbstractTextDocumentLayout::Selection> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),i_00);
        QTextCursor::setPosition((QTextCursor *)CONCAT44(iVar4,iVar3),pos,m);
      }
    }
    QList<QAbstractTextDocumentLayout::Selection>::operator[]
              ((QList<QAbstractTextDocumentLayout::Selection> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),i_00);
    QTextFormat::clearProperty
              ((QTextFormat *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (int)((ulong)i_00 >> 0x20));
    iVar4 = iVar4 + 1;
  }
  return;
}

Assistant:

static void adjustContextSelectionsForCell(QAbstractTextDocumentLayout::PaintContext &cell_context,
                                           const QTextTableCell &cell,
                                           int r, int c,
                                           const int *selectedTableCells)
{
    for (int i = 0; i < cell_context.selections.size(); ++i) {
        int row_start = selectedTableCells[i * 4];
        int col_start = selectedTableCells[i * 4 + 1];
        int num_rows = selectedTableCells[i * 4 + 2];
        int num_cols = selectedTableCells[i * 4 + 3];

        if (row_start != -1) {
            if (r >= row_start && r < row_start + num_rows
                && c >= col_start && c < col_start + num_cols)
            {
                int firstPosition = cell.firstPosition();
                int lastPosition = cell.lastPosition();

                // make sure empty cells are still selected
                if (firstPosition == lastPosition)
                    ++lastPosition;

                cell_context.selections[i].cursor.setPosition(firstPosition);
                cell_context.selections[i].cursor.setPosition(lastPosition, QTextCursor::KeepAnchor);
            } else {
                cell_context.selections[i].cursor.clearSelection();
            }
        }

        // FullWidthSelection is not useful for tables
        cell_context.selections[i].format.clearProperty(QTextFormat::FullWidthSelection);
    }
}